

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.cpp
# Opt level: O0

int __thiscall IntegerRandomGenerator::generate(IntegerRandomGenerator *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  uint local_38;
  uint32_t i;
  uint32_t distSize;
  double random;
  uniform_real_distribution<double> unif;
  IntegerRandomGenerator *this_local;
  
  unif._M_param._M_b = (double)this;
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&random,0.0,1.0);
  _i = std::uniform_real_distribution<double>::operator()
                 ((uniform_real_distribution<double> *)&random,&mRng);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->mDist);
  local_38 = 0;
  while( true ) {
    if ((uint)sVar1 <= local_38) {
      return -1;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(&this->mDist,(ulong)local_38);
    if (_i < *pvVar2) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(&this->mDist,(ulong)local_38);
    _i = _i - *pvVar2;
    local_38 = local_38 + 1;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::at(&this->mValues,(ulong)local_38);
  return *pvVar3;
}

Assistant:

int IntegerRandomGenerator::generate()
{
    std::uniform_real_distribution<double> unif(0,1);
    double random = unif(mRng);

    uint32_t distSize = static_cast<uint32_t>(mDist.size());
    for(uint32_t i = 0; i < distSize; i++)
    {
        if(random < mDist.at(i))
        {
            return mValues.at(i);
        }
        else
        {
            random -= mDist.at(i);
        }
    }

    return -1;
}